

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_parsed_linkage(lys_ypr_ctx_conflict *pctx,lysp_module *modp)

{
  ulong local_40;
  ulong local_30;
  ulong local_20;
  uint64_t u;
  lysp_module *modp_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  local_20 = 0;
  while( true ) {
    if (modp->imports == (lysp_import *)0x0) {
      local_30 = 0;
    }
    else {
      local_30 = *(ulong *)(modp->imports[-1].rev + 6);
    }
    if (local_30 <= local_20) break;
    if ((modp->imports[local_20].flags & 0x1000) == 0) {
      ypr_open(pctx,"import","module",modp->imports[local_20].name,'\x01');
      (pctx->field_0).field_0.level = (pctx->field_0).field_0.level + 1;
      yprp_extension_instances(pctx,LY_STMT_IMPORT,'\0',modp->imports[local_20].exts,(int8_t *)0x0);
      ypr_substmt(pctx,LY_STMT_PREFIX,'\0',modp->imports[local_20].prefix,
                  modp->imports[local_20].exts);
      if (modp->imports[local_20].rev[0] != '\0') {
        ypr_substmt(pctx,LY_STMT_REVISION_DATE,'\0',modp->imports[local_20].rev,
                    modp->imports[local_20].exts);
      }
      ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',modp->imports[local_20].dsc,
                  modp->imports[local_20].exts);
      ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',modp->imports[local_20].ref,
                  modp->imports[local_20].exts);
      (pctx->field_0).field_0.level = (pctx->field_0).field_0.level - 1;
      ypr_close(pctx,"import",'\x01');
    }
    local_20 = local_20 + 1;
  }
  local_20 = 0;
  while( true ) {
    if (modp->includes == (lysp_include *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = *(ulong *)(modp->includes[-1].rev + 8);
    }
    if (local_40 <= local_20) break;
    if (modp->includes[local_20].injected == '\0') {
      if ((((modp->includes[local_20].rev[0] == '\0') &&
           (modp->includes[local_20].dsc == (char *)0x0)) &&
          (modp->includes[local_20].ref == (char *)0x0)) &&
         (modp->includes[local_20].exts == (lysp_ext_instance *)0x0)) {
        ypr_open(pctx,"include","module",modp->includes[local_20].name,-1);
      }
      else {
        ypr_open(pctx,"include","module",modp->includes[local_20].name,'\x01');
        (pctx->field_0).field_0.level = (pctx->field_0).field_0.level + 1;
        yprp_extension_instances
                  (pctx,LY_STMT_INCLUDE,'\0',modp->includes[local_20].exts,(int8_t *)0x0);
        if (modp->includes[local_20].rev[0] != '\0') {
          ypr_substmt(pctx,LY_STMT_REVISION_DATE,'\0',modp->includes[local_20].rev,
                      modp->includes[local_20].exts);
        }
        ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',modp->includes[local_20].dsc,
                    modp->includes[local_20].exts);
        ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',modp->includes[local_20].ref,
                    modp->includes[local_20].exts);
        (pctx->field_0).field_0.level = (pctx->field_0).field_0.level - 1;
        ypr_close(pctx,"include",'\x01');
      }
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static void
yin_print_parsed_linkage(struct lys_ypr_ctx *pctx, const struct lysp_module *modp)
{
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(modp->imports, u) {
        if (modp->imports[u].flags & LYS_INTERNAL) {
            continue;
        }

        ypr_open(pctx, "import", "module", modp->imports[u].name, 1);
        LEVEL++;
        yprp_extension_instances(pctx, LY_STMT_IMPORT, 0, modp->imports[u].exts, NULL);
        ypr_substmt(pctx, LY_STMT_PREFIX, 0, modp->imports[u].prefix, modp->imports[u].exts);
        if (modp->imports[u].rev[0]) {
            ypr_substmt(pctx, LY_STMT_REVISION_DATE, 0, modp->imports[u].rev, modp->imports[u].exts);
        }
        ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, modp->imports[u].dsc, modp->imports[u].exts);
        ypr_substmt(pctx, LY_STMT_REFERENCE, 0, modp->imports[u].ref, modp->imports[u].exts);
        LEVEL--;
        ypr_close(pctx, "import", 1);
    }
    LY_ARRAY_FOR(modp->includes, u) {
        if (modp->includes[u].injected) {
            /* do not print the includes injected from submodules */
            continue;
        }
        if (modp->includes[u].rev[0] || modp->includes[u].dsc || modp->includes[u].ref || modp->includes[u].exts) {
            ypr_open(pctx, "include", "module", modp->includes[u].name, 1);
            LEVEL++;
            yprp_extension_instances(pctx, LY_STMT_INCLUDE, 0, modp->includes[u].exts, NULL);
            if (modp->includes[u].rev[0]) {
                ypr_substmt(pctx, LY_STMT_REVISION_DATE, 0, modp->includes[u].rev, modp->includes[u].exts);
            }
            ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, modp->includes[u].dsc, modp->includes[u].exts);
            ypr_substmt(pctx, LY_STMT_REFERENCE, 0, modp->includes[u].ref, modp->includes[u].exts);
            LEVEL--;
            ypr_close(pctx, "include", 1);
        } else {
            ypr_open(pctx, "include", "module", modp->includes[u].name, -1);
        }
    }
}